

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32arm.c
# Opt level: O0

uint8_t armle_reloc_elf2vlink(uint8_t rtype,RelocInsert *ri)

{
  long lVar1;
  undefined8 *in_RSI;
  byte in_DIL;
  uint8_t local_1;
  
  if (in_DIL < 0x28) {
    *(uint16_t *)(in_RSI + 1) = armle_reloc_elf2vlink::convertV4[in_DIL].bpos;
    *(uint16_t *)((long)in_RSI + 10) = armle_reloc_elf2vlink::convertV4[in_DIL].bsiz;
    lVar1 = armle_reloc_elf2vlink::convertV4[in_DIL].mask;
    in_RSI[2] = lVar1;
    if (lVar1 == 0) {
      memset(&armle_reloc_elf2vlink::ri2,0,0x18);
      *in_RSI = &armle_reloc_elf2vlink::ri2;
      if (in_DIL == 10) {
        in_RSI[2] = 0x7ff000;
        armle_reloc_elf2vlink::ri2.mask = 0xffe;
        armle_reloc_elf2vlink::ri2.bpos = 0x15;
        armle_reloc_elf2vlink::ri2.bsiz = 0xb;
      }
      else {
        ierror("armle_reloc_elf2vlink(): reloc %d unknown to expect a 2nd RelocInsert",(ulong)in_DIL
              );
      }
    }
    local_1 = armle_reloc_elf2vlink::convertV4[in_DIL].rtype;
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static uint8_t armle_reloc_elf2vlink(uint8_t rtype,struct RelocInsert *ri)
/* Determine vlink internal reloc type from ELF reloc type and fill in
   reloc-insert description informations.
   All fields of the RelocInsert structure are preset to zero. */
{
  /* Reloc conversion table for V.4-ABI - @@@ INCOMPLETE!!! */
  static struct ELF2vlink convertV4[] = {
    R_NONE,0,0,-1,
    R_PC,8,24,0x3fffffc,        /* PC24, deprecated! Use CALL or JUMP24! */
    R_ABS,0,32,-1,              /* ABS32 */
    R_PC,0,32,-1,               /* REL32 */
    R_PC,20,12,0x1fff,          /* LDR_PC_G0 */
    R_ABS,0,16,-1,              /* ABS16 */
    R_ABS,20,12,0xfff,          /* ABS12 */
    R_ABS,5,5,0x1f,             /* THM_ABS5 */
    R_ABS,0,8,-1,               /* ABS8 */
    R_SD,0,32,-1,               /* SBREL32 */
    R_PC,5,11,0,                /* THM_CALL, needs 2nd ri */
    R_PC,8,8,0x3fc,             /* THM_PC8 */
    R_NONE,0,0,-1,
    R_ABS,8,24,0xffffff,        /* SWI24, obsolete! */
    R_ABS,8,8,0xff,             /* THM_SWI8, obsolete! */
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_PC,8,24,0x3fffffc,        /* CALL, PC24 for uncond. bl/blx only */
    R_PC,8,24,0x3fffffc,        /* JUMP24, PC24 for other branches */
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_PC,24,8,0xff,             /* ALU_PCREL_7_0, obsolete! */
    R_PC,24,8,0xff00,           /* ALU_PCREL_15_8, obsolete! */
    R_PC,24,8,0xff0000,         /* ALU_PCREL_23_15, obsolete! */
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
    R_NONE,0,0,-1,
  };
  static struct RelocInsert ri2;

  if (rtype < R_ARM_V4BX) {
    ri->bpos = convertV4[rtype].bpos;
    ri->bsiz = convertV4[rtype].bsiz;
    if ((ri->mask = convertV4[rtype].mask) == 0) {
      /* needs a 2nd RelocInsert */
      memset(&ri2,0,sizeof(struct RelocInsert));
      ri->next = &ri2;
      if (rtype == R_ARM_THM_CALL) {
        /* a 23-bit branch consisting of two THUMB instruction */
        ri->mask = 0x7ff000;
        ri2.mask = 0xffe;
        ri2.bpos = 16+5;
        ri2.bsiz = 11;
      }
      else {
        ierror("armle_reloc_elf2vlink(): reloc %d unknown to expect "
               "a 2nd RelocInsert",rtype);
      }
    }
    return convertV4[rtype].rtype;
  }

  return R_NONE;
}